

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O1

void benchmark::Initialize(int *argc,char **argv)

{
  internal::ParseCommandLineFlags(argc,argv);
  internal::SetLogLevel(FLAGS_v);
  MyCPUUsage();
  walltime::Now();
  return;
}

Assistant:

void Initialize(int* argc, char** argv) {
  internal::ParseCommandLineFlags(argc, argv);
  internal::SetLogLevel(FLAGS_v);
  // TODO remove this. It prints some output the first time it is called.
  // We don't want to have this ouput printed during benchmarking.
  MyCPUUsage();
  // The first call to walltime::Now initialized it. Call it once to
  // prevent the initialization from happening in a benchmark.
  walltime::Now();
}